

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O3

void __thiscall BoardView::LoadBoard(BoardView *this,BRDFileBase *file)

{
  vector<BRDPoint,_std::allocator<BRDPoint>_> *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pBVar7;
  BRDBoard *this_02;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  shared_ptr<Point> *pa;
  undefined8 *puVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  shared_ptr<Net> *n;
  long *plVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar20;
  ImVec2 IVar19;
  float fVar21;
  float fVar22;
  uint uVar23;
  float fVar24;
  uint uVar25;
  float fVar26;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  netnames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  partnames;
  vector<BRDPin,_std::allocator<BRDPin>_> local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  uint local_78;
  uint uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> local_60;
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> local_48;
  
  if (this->m_board != (Board *)0x0) {
    (*this->m_board->_vptr_Board[1])();
  }
  if (((ulong)((long)(file->outline_segments).
                     super__Vector_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(file->outline_segments).
                    super__Vector_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) < 0x21) &&
     ((ulong)((long)(file->format).super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(file->format).super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                   super__Vector_impl_data._M_start) < 0x11)) {
    this_00 = &file->format;
    std::vector<BRDPin,_std::allocator<BRDPin>_>::vector(&local_b8,&file->pins);
    if (local_b8.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data
        ._M_start ==
        local_b8.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      iVar9 = 0x7fffff37;
      iVar11 = -0x7fffff38;
      iVar12 = -0x7fffff38;
      iVar10 = 0x7fffff37;
    }
    else {
      iVar12 = -0x80000000;
      iVar10 = 0x7fffffff;
      iVar9 = 0x7fffffff;
      iVar11 = -0x80000000;
      pBVar7 = local_b8.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        iVar3 = (pBVar7->pos).x;
        if (iVar12 < iVar3) {
          iVar12 = iVar3;
        }
        iVar4 = (pBVar7->pos).y;
        if (iVar11 < iVar4) {
          iVar11 = iVar4;
        }
        if (iVar3 < iVar10) {
          iVar10 = iVar3;
        }
        if (iVar4 < iVar9) {
          iVar9 = iVar4;
        }
        pBVar7 = pBVar7 + 1;
      } while (pBVar7 != local_b8.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      iVar12 = iVar12 + 200;
      iVar11 = iVar11 + 200;
      iVar10 = iVar10 + -200;
      iVar9 = iVar9 + -200;
    }
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(iVar9,iVar10);
    std::vector<BRDPoint,_std::allocator<BRDPoint>_>::emplace_back<BRDPoint>
              (this_00,(BRDPoint *)&local_98);
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(iVar9,iVar12);
    std::vector<BRDPoint,_std::allocator<BRDPoint>_>::emplace_back<BRDPoint>
              (this_00,(BRDPoint *)&local_98);
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(iVar11,iVar12);
    std::vector<BRDPoint,_std::allocator<BRDPoint>_>::emplace_back<BRDPoint>
              (this_00,(BRDPoint *)&local_98);
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(iVar11,iVar10);
    std::vector<BRDPoint,_std::allocator<BRDPoint>_>::emplace_back<BRDPoint>
              (this_00,(BRDPoint *)&local_98);
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(iVar9,iVar10);
    std::vector<BRDPoint,_std::allocator<BRDPoint>_>::emplace_back<BRDPoint>
              (this_00,(BRDPoint *)&local_98);
    if (local_b8.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  this_02 = (BRDBoard *)operator_new(0x88);
  BRDBoard::BRDBoard(this_02,file);
  this->m_board = (Board *)this_02;
  iVar12 = (*(this_02->super_Board)._vptr_Board[3])(this_02);
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::vector
            (&local_48,
             (vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
             CONCAT44(extraout_var,iVar12));
  Searcher::setParts(&this->searcher,&local_48);
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::~vector
            (&local_48);
  iVar12 = (*this->m_board->_vptr_Board[2])();
  std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::vector
            (&local_60,
             (vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)
             CONCAT44(extraout_var_00,iVar12));
  Searcher::setNets(&this->searcher,&local_60);
  std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::~vector(&local_60);
  local_b8.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b8.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_b8.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar12 = (*this->m_board->_vptr_Board[2])();
  plVar13 = *(long **)CONCAT44(extraout_var_01,iVar12);
  plVar5 = (long *)((long *)CONCAT44(extraout_var_01,iVar12))[1];
  if (plVar13 != plVar5) {
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_b8,(value_type *)(*plVar13 + 0x10));
      plVar13 = plVar13 + 2;
    } while (plVar13 != plVar5);
  }
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar12 = (*this->m_board->_vptr_Board[3])();
  plVar13 = *(long **)CONCAT44(extraout_var_02,iVar12);
  plVar5 = (long *)((long *)CONCAT44(extraout_var_02,iVar12))[1];
  if (plVar13 != plVar5) {
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_b8,(value_type *)(*plVar13 + 0x18));
      plVar13 = plVar13 + 2;
    } while (plVar13 != plVar5);
  }
  SpellCorrector::setDictionary
            (&this->scnets,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_b8);
  SpellCorrector::setDictionary(&this->scparts,&local_98);
  iVar12 = (*this->m_board->_vptr_Board[2])();
  std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::operator=
            (&this->m_nets,
             (vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)
             CONCAT44(extraout_var_03,iVar12));
  iVar12 = (*this->m_board->_vptr_Board[5])();
  puVar8 = *(undefined8 **)CONCAT44(extraout_var_04,iVar12);
  puVar6 = (undefined8 *)((undefined8 *)CONCAT44(extraout_var_04,iVar12))[1];
  if (puVar8 == puVar6) {
    uVar14 = 0x80000000;
    uVar15 = 0x80000000;
    local_78 = 0x7fffffff;
    uStack_74 = 0x7fffffff;
  }
  else {
    uVar14 = 0x80000000;
    uVar15 = 0x80000000;
    local_78 = 0x7fffffff;
    uStack_74 = 0x7fffffff;
    do {
      fVar22 = (float)*(undefined8 *)*puVar8;
      fVar24 = (float)((ulong)*(undefined8 *)*puVar8 >> 0x20);
      local_78 = ~-(uint)(fVar22 < (float)(int)local_78) & local_78 |
                 (int)fVar22 & -(uint)(fVar22 < (float)(int)local_78);
      uStack_74 = ~-(uint)(fVar24 < (float)(int)uStack_74) & uStack_74 |
                  (int)fVar24 & -(uint)(fVar24 < (float)(int)uStack_74);
      uVar14 = ~-(uint)((float)(int)uVar14 < fVar22) & uVar14 |
               (int)fVar22 & -(uint)((float)(int)uVar14 < fVar22);
      uVar15 = ~-(uint)((float)(int)uVar15 < fVar24) & uVar15 |
               (int)fVar24 & -(uint)((float)(int)uVar15 < fVar24);
      puVar8 = puVar8 + 2;
    } while (puVar8 != puVar6);
  }
  uStack_70 = 0;
  uStack_6c = 0;
  iVar12 = (*this->m_board->_vptr_Board[6])();
  uVar23 = local_78;
  uVar17 = uStack_74;
  for (puVar8 = *(undefined8 **)CONCAT44(extraout_var_05,iVar12);
      puVar8 != (undefined8 *)((undefined8 *)CONCAT44(extraout_var_05,iVar12))[1];
      puVar8 = puVar8 + 2) {
    fVar22 = (float)*puVar8;
    fVar24 = (float)((ulong)*puVar8 >> 0x20);
    uVar23 = ~-(uint)(fVar22 < (float)(int)uVar23) & uVar23 |
             (int)fVar22 & -(uint)(fVar22 < (float)(int)uVar23);
    uVar25 = ~-(uint)(fVar24 < (float)(int)uVar17) & uVar17 |
             (int)fVar24 & -(uint)(fVar24 < (float)(int)uVar17);
    fVar21 = (float)puVar8[1];
    fVar26 = (float)((ulong)puVar8[1] >> 0x20);
    uVar18 = ~-(uint)((float)(int)uVar14 < fVar22) & uVar14 |
             (int)fVar22 & -(uint)((float)(int)uVar14 < fVar22);
    uVar20 = ~-(uint)((float)(int)uVar15 < fVar24) & uVar15 |
             (int)fVar24 & -(uint)((float)(int)uVar15 < fVar24);
    uVar14 = -(uint)((float)(int)uVar18 < fVar21);
    uVar16 = -(uint)((float)(int)uVar20 < fVar26);
    uVar15 = -(uint)(fVar21 < (float)(int)uVar23);
    uVar17 = -(uint)(fVar26 < (float)(int)uVar25);
    uVar23 = ~uVar15 & uVar23 | (int)fVar21 & uVar15;
    uVar17 = ~uVar17 & uVar25 | (int)fVar26 & uVar17;
    uVar14 = ~uVar14 & uVar18 | (int)fVar21 & uVar14;
    uVar15 = ~uVar16 & uVar20 | (int)fVar26 & uVar16;
  }
  fVar22 = (this->m_board_surface).x;
  fVar24 = (this->m_board_surface).y;
  fVar21 = (float)(int)(uVar14 - uVar23) * 1.1;
  fVar26 = (float)(int)(uVar15 - uVar17) * 1.1;
  uVar16 = -(uint)(0.0 < fVar21);
  fVar21 = (float)(~uVar16 & 0x3f800000 | (uint)(fVar22 / fVar21) & uVar16);
  uVar16 = -(uint)(0.0 < fVar26);
  fVar26 = (float)(~uVar16 & 0x3f800000 | (uint)(fVar24 / fVar26) & uVar16);
  if (fVar26 <= fVar21) {
    fVar21 = fVar26;
  }
  this->m_scale = fVar21;
  this->m_scale_floor = fVar21;
  this->m_boardWidth = uVar14 - uVar23;
  this->m_boardHeight = uVar15 - uVar17;
  fVar21 = (float)(int)(uVar23 + uVar14) * 0.5;
  fVar26 = (float)(int)(uVar17 + uVar15) * 0.5;
  this->m_mx = fVar21;
  this->m_my = fVar26;
  IVar19 = ScreenToCoord(this,fVar22 * 0.5,fVar24 * 0.5,1.0);
  uVar1 = this->m_dx;
  uVar2 = this->m_dy;
  this->m_dx = (float)uVar1 + (IVar19.x - fVar21);
  this->m_dy = (float)uVar2 + (IVar19.y - fVar26);
  iVar12 = (*this->m_board->_vptr_Board[3])();
  std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::reserve
            (&this->m_pinHighlighted,
             ((long *)CONCAT44(extraout_var_06,iVar12))[1] -
             *(long *)CONCAT44(extraout_var_06,iVar12) >> 4);
  iVar12 = (*this->m_board->_vptr_Board[3])();
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::reserve
            (&this->m_partHighlighted,
             ((long *)CONCAT44(extraout_var_07,iVar12))[1] -
             *(long *)CONCAT44(extraout_var_07,iVar12) >> 4);
  this_01 = (this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  this->m_firstFrame = true;
  this->m_needsRedraw = true;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_b8);
  return;
}

Assistant:

void BoardView::LoadBoard(BRDFileBase *file) {
	delete m_board;

	// Check board outline (format) point count.
	//		If we don't have an outline, generate one
	//
	if (file->outline_segments.size() < 3 && file->format.size() < 3) {
		auto pins = file->pins;
		int minx, maxx, miny, maxy;
		int margin = 200; // #define or leave this be? Rather arbritary.

		minx = miny = INT_MAX;
		maxx = maxy = INT_MIN;

		for (auto a : pins) {
			if (a.pos.x > maxx) maxx = a.pos.x;
			if (a.pos.y > maxy) maxy = a.pos.y;
			if (a.pos.x < minx) minx = a.pos.x;
			if (a.pos.y < miny) miny = a.pos.y;
		}

		maxx += margin;
		maxy += margin;
		minx -= margin;
		miny -= margin;

		file->format.push_back({minx, miny});
		file->format.push_back({maxx, miny});
		file->format.push_back({maxx, maxy});
		file->format.push_back({minx, maxy});
		file->format.push_back({minx, miny});
	}

	m_board = new BRDBoard(file);
	searcher.setParts(m_board->Components());
	searcher.setNets(m_board->Nets());

	std::vector<std::string> netnames;
	for (auto &n : m_board->Nets()) netnames.push_back(n->name);
	std::vector<std::string> partnames;
	for (auto &p : m_board->Components()) netnames.push_back(p->name);

	scnets.setDictionary(netnames);
	scparts.setDictionary(partnames);

	m_nets = m_board->Nets();

	int min_x = INT_MAX, max_x = INT_MIN, min_y = INT_MAX, max_y = INT_MIN;
	for (auto &pa : m_board->OutlinePoints()) {
		if (pa->x < min_x) min_x = pa->x;
		if (pa->y < min_y) min_y = pa->y;
		if (pa->x > max_x) max_x = pa->x;
		if (pa->y > max_y) max_y = pa->y;
	}
	for (auto &s: m_board->OutlineSegments()) {
		if (s.first.x < min_x) min_x = s.first.x;
		if (s.second.x < min_x) min_x = s.second.x;
		if (s.first.y < min_y) min_y = s.first.y;
		if (s.second.y < min_y) min_y = s.second.y;
		if (s.first.x > max_x) max_x = s.first.x;
		if (s.second.x > max_x) max_x = s.second.x;
		if (s.first.y > max_y) max_y = s.first.y;
		if (s.second.y > max_y) max_y = s.second.y;
	}

	// ImVec2 view = ImGui::GetIO().DisplaySize;
	ImVec2 view = m_board_surface;

	m_mx = (float)(min_x + max_x) / 2.0f;
	m_my = (float)(min_y + max_y) / 2.0f;

	float dx = 1.1f * (max_x - min_x);
	float dy = 1.1f * (max_y - min_y);
	float sx = dx > 0 ? view.x / dx : 1.0f;
	float sy = dy > 0 ? view.y / dy : 1.0f;

	m_scale_floor = m_scale = sx < sy ? sx : sy;
	m_boardWidth            = max_x - min_x;
	m_boardHeight           = max_y - min_y;
	SetTarget(m_mx, m_my);

	m_pinHighlighted.reserve(m_board->Components().size());
	m_partHighlighted.reserve(m_board->Components().size());
	m_pinSelected = nullptr;

	m_firstFrame  = true;
	m_needsRedraw = true;
}